

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

void * json_alloc(json_state *state,unsigned_long size,int zero)

{
  ulong uVar1;
  ulong uVar2;
  void *pvVar3;
  
  if ((size <= state->ulong_max - state->used_memory) &&
     ((uVar1 = (state->settings).max_memory, uVar1 == 0 ||
      (uVar2 = state->used_memory + size, state->used_memory = uVar2, uVar2 <= uVar1)))) {
    pvVar3 = (*(state->settings).mem_alloc)(size,zero,(state->settings).user_data);
    return pvVar3;
  }
  return (void *)0x0;
}

Assistant:

static void * json_alloc (json_state * state, unsigned long size, int zero)
{
   if ((state->ulong_max - state->used_memory) < size)
      return 0;

   if (state->settings.max_memory
         && (state->used_memory += size) > state->settings.max_memory)
   {
      return 0;
   }

   return state->settings.mem_alloc (size, zero, state->settings.user_data);
}